

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamEuler::EvaluateSectionDisplacement
          (ChElementBeamEuler *this,double eta,ChVector<double> *u_displ,ChVector<double> *u_rotaz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ChVectorDynamic<> displ;
  ShapeVector N;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  double local_70;
  ShapeVector local_68;
  
  local_70 = eta;
  iVar15 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[3])();
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_88,(long)iVar15);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_88);
  ShapeFunctions(this,&local_68,local_70);
  if ((0 < local_88.m_storage.m_rows) && (6 < (ulong)local_88.m_storage.m_rows)) {
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
         array[0];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *local_88.m_storage.m_data;
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
         array[3] * local_88.m_storage.m_data[6];
    auVar1 = vfmadd231sd_fma(auVar20,auVar16,auVar1);
    u_displ->m_data[0] = auVar1._0_8_;
    if ((local_88.m_storage.m_rows != 7) && (0xb < (ulong)local_88.m_storage.m_rows)) {
      auVar21._8_8_ = 0;
      auVar21._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[1];
      auVar25._8_8_ = 0;
      auVar25._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[2];
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[5];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_88.m_storage.m_data[1];
      auVar28._8_8_ = 0;
      auVar28._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[4] * local_88.m_storage.m_data[7];
      auVar1 = vfmadd231sd_fma(auVar28,auVar21,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_88.m_storage.m_data[5];
      auVar1 = vfmadd231sd_fma(auVar1,auVar25,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_88.m_storage.m_data[0xb];
      auVar1 = vfmadd231sd_fma(auVar1,auVar27,auVar4);
      u_displ->m_data[1] = auVar1._0_8_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_88.m_storage.m_data[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[4] * local_88.m_storage.m_data[8];
      auVar1 = vfmadd231sd_fma(auVar23,auVar21,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_88.m_storage.m_data[4];
      auVar1 = vfnmadd231sd_fma(auVar1,auVar25,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_88.m_storage.m_data[10];
      auVar1 = vfnmadd231sd_fma(auVar1,auVar27,auVar7);
      u_displ->m_data[2] = auVar1._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_88.m_storage.m_data[3];
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[3] * local_88.m_storage.m_data[9];
      auVar1 = vfmadd231sd_fma(auVar18,auVar16,auVar8);
      u_rotaz->m_data[0] = auVar1._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[6];
      auVar24._8_8_ = 0;
      auVar24._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[8];
      auVar26._8_8_ = 0;
      auVar26._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[9];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_88.m_storage.m_data[2];
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[7] * local_88.m_storage.m_data[8];
      auVar1 = vfnmsub231sd_fma(auVar22,auVar17,auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_88.m_storage.m_data[4];
      auVar1 = vfmadd231sd_fma(auVar1,auVar24,auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_88.m_storage.m_data[10];
      auVar1 = vfmadd231sd_fma(auVar1,auVar26,auVar11);
      u_rotaz->m_data[1] = auVar1._0_8_;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_88.m_storage.m_data[1];
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
           array[7] * local_88.m_storage.m_data[7];
      auVar1 = vfmadd231sd_fma(auVar19,auVar17,auVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_88.m_storage.m_data[5];
      auVar1 = vfmadd231sd_fma(auVar1,auVar24,auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_88.m_storage.m_data[0xb];
      auVar1 = vfmadd231sd_fma(auVar1,auVar26,auVar14);
      u_rotaz->m_data[2] = auVar1._0_8_;
      free((void *)local_88.m_storage.m_data[-1]);
      return;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementBeamEuler::EvaluateSectionDisplacement(const double eta, ChVector<>& u_displ, ChVector<>& u_rotaz) {
    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);

    ShapeVector N;
    ShapeFunctions(N, eta);  // Evaluate compressed shape functions

    u_displ.x() = N(0) * displ(0) + N(3) * displ(6);     // x_a   x_b
    u_displ.y() = N(1) * displ(1) + N(4) * displ(7)      // y_a   y_b
                  + N(2) * displ(5) + N(5) * displ(11);  // Rz_a  Rz_b
    u_displ.z() = N(1) * displ(2) + N(4) * displ(8)      // z_a   z_b
                  - N(2) * displ(4) - N(5) * displ(10);  // Ry_a  Ry_b

    u_rotaz.x() = N(0) * displ(3) + N(3) * displ(9);    // Rx_a  Rx_b
    u_rotaz.y() = -N(6) * displ(2) - N(7) * displ(8) +  // z_a   z_b   note - sign
                  N(8) * displ(4) + N(9) * displ(10);   // Ry_a  Ry_b
    u_rotaz.z() = N(6) * displ(1) + N(7) * displ(7) +   // y_a   y_b
                  N(8) * displ(5) + N(9) * displ(11);   // Rz_a  Rz_b
}